

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprNodeTest_NOT(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  undefined4 uVar1;
  Fts5ExprNode *p1;
  Fts5ExprNode *p2;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  
  p1 = pNode->apChild[0];
  p2 = *(Fts5ExprNode **)(pNode + 1);
  do {
    if (p1->bEof != 0) {
      pNode->bEof = p1->bEof;
      pNode->bNomatch = p1->bNomatch;
      pNode->iRowid = p1->iRowid;
      iVar4 = 0;
      goto LAB_001ceb4d;
    }
    iVar3 = fts5NodeCompare(pExpr,p1,p2);
    if (iVar3 < 1) {
      iVar4 = 0;
    }
    else {
      iVar4 = (*p2->xNext)(pExpr,p2,1,p1->iRowid);
      iVar3 = fts5NodeCompare(pExpr,p1,p2);
    }
  } while (((iVar3 == 0) && (p2->bNomatch == 0)) && (iVar4 = (*p1->xNext)(pExpr,p1,0,0), iVar4 == 0)
          );
  uVar1 = p1->bEof;
  uVar2 = p1->bNomatch;
  pNode->bEof = uVar1;
  pNode->bNomatch = uVar2;
  pNode->iRowid = p1->iRowid;
  if (uVar1 != 0) {
LAB_001ceb4d:
    fts5ExprNodeZeroPoslist(p2);
  }
  return iVar4;
}

Assistant:

static int fts5ExprNodeTest_NOT(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode             /* FTS5_NOT node to advance */
){
  int rc = SQLITE_OK;
  Fts5ExprNode *p1 = pNode->apChild[0];
  Fts5ExprNode *p2 = pNode->apChild[1];
  assert( pNode->nChild==2 );

  while( rc==SQLITE_OK && p1->bEof==0 ){
    int cmp = fts5NodeCompare(pExpr, p1, p2);
    if( cmp>0 ){
      rc = fts5ExprNodeNext(pExpr, p2, 1, p1->iRowid);
      cmp = fts5NodeCompare(pExpr, p1, p2);
    }
    assert( rc!=SQLITE_OK || cmp<=0 );
    if( cmp || p2->bNomatch ) break;
    rc = fts5ExprNodeNext(pExpr, p1, 0, 0);
  }
  pNode->bEof = p1->bEof;
  pNode->bNomatch = p1->bNomatch;
  pNode->iRowid = p1->iRowid;
  if( p1->bEof ){
    fts5ExprNodeZeroPoslist(p2);
  }
  return rc;
}